

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

ShaderResourceUsage *
deqp::gles31::Functional::getShaderResourceUsage
          (ShaderResourceUsage *__return_storage_ptr__,Program *program,Shader *shader)

{
  int iVar1;
  ShaderType SVar2;
  deUint32 dVar3;
  ShaderResourceUsage *retVal;
  Shader *shader_local;
  Program *program_local;
  
  iVar1 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_IN);
  __return_storage_ptr__->numInputs = iVar1;
  iVar1 = anon_unknown_3::getNumVectors(shader,STORAGE_IN);
  __return_storage_ptr__->numInputVectors = iVar1;
  iVar1 = anon_unknown_3::getNumComponents(shader,STORAGE_IN);
  __return_storage_ptr__->numInputComponents = iVar1;
  iVar1 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_OUT);
  __return_storage_ptr__->numOutputs = iVar1;
  iVar1 = anon_unknown_3::getNumVectors(shader,STORAGE_OUT);
  __return_storage_ptr__->numOutputVectors = iVar1;
  iVar1 = anon_unknown_3::getNumComponents(shader,STORAGE_OUT);
  __return_storage_ptr__->numOutputComponents = iVar1;
  iVar1 = anon_unknown_3::getNumComponents(shader,STORAGE_PATCH_IN);
  __return_storage_ptr__->numPatchInputComponents = iVar1;
  iVar1 = anon_unknown_3::getNumComponents(shader,STORAGE_PATCH_OUT);
  __return_storage_ptr__->numPatchOutputComponents = iVar1;
  iVar1 = anon_unknown_3::getNumDefaultBlockComponents(shader,STORAGE_UNIFORM);
  __return_storage_ptr__->numDefaultBlockUniformComponents = iVar1;
  iVar1 = anon_unknown_3::getNumComponents(shader,STORAGE_UNIFORM);
  __return_storage_ptr__->numCombinedUniformComponents = iVar1;
  iVar1 = anon_unknown_3::getNumVectors(shader,STORAGE_UNIFORM);
  __return_storage_ptr__->numUniformVectors = iVar1;
  iVar1 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeSampler);
  __return_storage_ptr__->numSamplers = iVar1;
  iVar1 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeImage);
  __return_storage_ptr__->numImages = iVar1;
  iVar1 = anon_unknown_3::getNumAtomicCounterBuffers(shader);
  __return_storage_ptr__->numAtomicCounterBuffers = iVar1;
  iVar1 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeAtomicCounter);
  __return_storage_ptr__->numAtomicCounters = iVar1;
  iVar1 = anon_unknown_3::getNumShaderBlocks(shader,STORAGE_UNIFORM);
  __return_storage_ptr__->numUniformBlocks = iVar1;
  iVar1 = anon_unknown_3::getNumShaderBlocks(shader,STORAGE_BUFFER);
  __return_storage_ptr__->numShaderStorageBlocks = iVar1;
  SVar2 = ProgramInterfaceDefinition::Shader::getType(shader);
  switch(SVar2) {
  case SHADERTYPE_VERTEX:
    break;
  case SHADERTYPE_FRAGMENT:
    break;
  case SHADERTYPE_GEOMETRY:
    __return_storage_ptr__->numInputs = __return_storage_ptr__->numInputs + 1;
    __return_storage_ptr__->numInputVectors = __return_storage_ptr__->numInputVectors + 1;
    __return_storage_ptr__->numInputComponents = __return_storage_ptr__->numInputComponents + 4;
    __return_storage_ptr__->numOutputs = __return_storage_ptr__->numOutputs + 1;
    __return_storage_ptr__->numOutputVectors = __return_storage_ptr__->numOutputVectors + 1;
    __return_storage_ptr__->numOutputComponents = __return_storage_ptr__->numOutputComponents + 4;
    break;
  case SHADERTYPE_TESSELLATION_CONTROL:
    dVar3 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numInputs = dVar3 + __return_storage_ptr__->numInputs;
    dVar3 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numInputVectors = dVar3 + __return_storage_ptr__->numInputVectors;
    dVar3 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numInputComponents =
         dVar3 * 4 + __return_storage_ptr__->numInputComponents;
    dVar3 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numOutputs = dVar3 + __return_storage_ptr__->numOutputs;
    dVar3 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numOutputVectors = dVar3 + __return_storage_ptr__->numOutputVectors;
    dVar3 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numOutputComponents =
         dVar3 * 4 + __return_storage_ptr__->numOutputComponents;
    break;
  case SHADERTYPE_TESSELLATION_EVALUATION:
    dVar3 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numInputs = dVar3 + __return_storage_ptr__->numInputs;
    dVar3 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numInputVectors = dVar3 + __return_storage_ptr__->numInputVectors;
    dVar3 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numInputComponents =
         dVar3 * 4 + __return_storage_ptr__->numInputComponents;
    __return_storage_ptr__->numOutputs = __return_storage_ptr__->numOutputs + 1;
    __return_storage_ptr__->numOutputVectors = __return_storage_ptr__->numOutputVectors + 1;
    __return_storage_ptr__->numOutputComponents = __return_storage_ptr__->numOutputComponents + 4;
    break;
  case SHADERTYPE_COMPUTE:
  }
  return __return_storage_ptr__;
}

Assistant:

ProgramInterfaceDefinition::ShaderResourceUsage getShaderResourceUsage (const ProgramInterfaceDefinition::Program* program, const ProgramInterfaceDefinition::Shader* shader)
{
	ProgramInterfaceDefinition::ShaderResourceUsage retVal;

	retVal.numInputs						= getNumTypeInstances(shader, glu::STORAGE_IN);
	retVal.numInputVectors					= getNumVectors(shader, glu::STORAGE_IN);
	retVal.numInputComponents				= getNumComponents(shader, glu::STORAGE_IN);

	retVal.numOutputs						= getNumTypeInstances(shader, glu::STORAGE_OUT);
	retVal.numOutputVectors					= getNumVectors(shader, glu::STORAGE_OUT);
	retVal.numOutputComponents				= getNumComponents(shader, glu::STORAGE_OUT);

	retVal.numPatchInputComponents			= getNumComponents(shader, glu::STORAGE_PATCH_IN);
	retVal.numPatchOutputComponents			= getNumComponents(shader, glu::STORAGE_PATCH_OUT);

	retVal.numDefaultBlockUniformComponents	= getNumDefaultBlockComponents(shader, glu::STORAGE_UNIFORM);
	retVal.numCombinedUniformComponents		= getNumComponents(shader, glu::STORAGE_UNIFORM);
	retVal.numUniformVectors				= getNumVectors(shader, glu::STORAGE_UNIFORM);

	retVal.numSamplers						= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeSampler);
	retVal.numImages						= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeImage);

	retVal.numAtomicCounterBuffers			= getNumAtomicCounterBuffers(shader);
	retVal.numAtomicCounters				= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeAtomicCounter);

	retVal.numUniformBlocks					= getNumShaderBlocks(shader, glu::STORAGE_UNIFORM);
	retVal.numShaderStorageBlocks			= getNumShaderBlocks(shader, glu::STORAGE_BUFFER);

	// add builtins
	switch (shader->getType())
	{
		case glu::SHADERTYPE_VERTEX:
			// gl_Position is not counted
			break;

		case glu::SHADERTYPE_FRAGMENT:
			// nada
			break;

		case glu::SHADERTYPE_GEOMETRY:
			// gl_Position in (point mode => size 1)
			retVal.numInputs			+= 1;
			retVal.numInputVectors		+= 1;
			retVal.numInputComponents	+= 4;

			// gl_Position out
			retVal.numOutputs			+= 1;
			retVal.numOutputVectors		+= 1;
			retVal.numOutputComponents	+= 4;
			break;

		case glu::SHADERTYPE_TESSELLATION_CONTROL:
			// gl_Position in is read up to gl_InstanceID
			retVal.numInputs			+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numInputVectors		+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numInputComponents	+= 4 * program->getTessellationNumOutputPatchVertices();

			// gl_Position out, size = num patch out vertices
			retVal.numOutputs			+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numOutputVectors		+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numOutputComponents	+= 4 * program->getTessellationNumOutputPatchVertices();
			break;

		case glu::SHADERTYPE_TESSELLATION_EVALUATION:
			// gl_Position in is read up to gl_InstanceID
			retVal.numInputs			+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numInputVectors		+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numInputComponents	+= 4 * program->getTessellationNumOutputPatchVertices();

			// gl_Position out
			retVal.numOutputs			+= 1;
			retVal.numOutputVectors		+= 1;
			retVal.numOutputComponents	+= 4;
			break;

		case glu::SHADERTYPE_COMPUTE:
			// nada
			break;

		default:
			DE_ASSERT(false);
			break;
	}
	return retVal;
}